

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O1

int main(void)

{
  double *pdVar1;
  char cVar2;
  result_type rVar3;
  istream *piVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  char *__function;
  uint uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  string line;
  MatrixXd accuracy;
  MatrixXd batch_X;
  MatrixXd y;
  MatrixXd X;
  MatrixXd batch_y;
  string delimiter;
  default_random_engine generator;
  uniform_int_distribution<int> distribution;
  MatrixXd validate_y;
  MatrixXd validate_X;
  ANN n;
  ifstream file;
  DenseStorage<double,__1,__1,__1,_0> local_4e0;
  long local_4c8;
  undefined8 local_4c0;
  long local_4b8;
  double local_4b0;
  DenseStorage<double,__1,__1,__1,_0> local_4a8;
  long local_490;
  undefined8 local_488;
  undefined8 local_480;
  DenseStorage<double,__1,__1,__1,_0> local_478;
  double local_458;
  undefined8 uStack_450;
  void *local_440;
  long local_438;
  long local_430;
  void *local_428;
  long local_420;
  long local_418;
  DenseStorage<double,__1,__1,__1,_0> local_410;
  long *local_3f8 [2];
  long local_3e8 [2];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_3d8;
  param_type local_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  DenseStorage<double,__1,__1,__1,_0> local_368;
  DenseStorage<double,__1,__1,__1,_0> local_350;
  DenseStorage<double,__1,__1,__1,_0> local_338;
  DenseStorage<double,__1,__1,__1,_0> local_320;
  ANN local_308;
  DenseStorage<double,__1,__1,__1,_0> local_2c8;
  DenseStorage<double,__1,__1,__1,_0> local_2b0;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  DenseStorage<double,__1,__1,__1,_0> local_280;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  DenseStorage<double,__1,__1,__1,_0> local_250;
  long local_238 [65];
  
  ANN::ANN(&local_308);
  ANN::setInputSize(&local_308,4);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"tanh","");
  ANN::addLayer(&local_308,0x32,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"tanh","");
  ANN::addLayer(&local_308,0x32,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"sigmoid","");
  ANN::addLayer(&local_308,3,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream(local_238,"/home/haukur/MasterProject/Plotting/iris.csv",_S_in);
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,",","");
  local_4e0.m_data = (double *)0x96;
  local_4e0.m_rows = 4;
  local_4e0.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_428,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4e0);
  local_4e0.m_data = (double *)0x96;
  local_4e0.m_rows = 3;
  local_4e0.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_440,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4e0);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_4e0.m_data = (double *)&local_4e0.m_cols;
    local_4e0.m_rows = 0;
    local_4e0.m_cols = local_4e0.m_cols & 0xffffffffffffff00;
    local_458 = 0.0;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_4e0,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      lVar5 = std::__cxx11::string::find((char *)&local_4e0,(ulong)local_3f8[0],0);
      if (lVar5 != -1) {
        lVar5 = -1;
        do {
          std::__cxx11::string::substr((ulong)&local_4a8,(ulong)&local_4e0);
          pdVar1 = local_4a8.m_data;
          piVar6 = __errno_location();
          iVar9 = *piVar6;
          *piVar6 = 0;
          dVar12 = strtod((char *)pdVar1,(char **)&local_478);
          if (local_478.m_data == pdVar1) {
            std::__throw_invalid_argument("stod");
LAB_00107310:
            std::__throw_invalid_argument("stod");
LAB_0010731c:
            std::__throw_out_of_range("stod");
LAB_00107328:
            std::__throw_invalid_argument("stod");
LAB_00107334:
            std::__throw_out_of_range("stod");
LAB_00107340:
            std::__throw_out_of_range("stod");
            goto LAB_0010734c;
          }
          if (*piVar6 != 0) {
            if (*piVar6 != 0x22) goto LAB_00106a65;
            goto LAB_0010731c;
          }
          *piVar6 = iVar9;
LAB_00106a65:
          if (local_4a8.m_data != (double *)&local_4a8.m_cols) {
            local_4b0 = dVar12;
            operator_delete(local_4a8.m_data,(ulong)((long)(double **)local_4a8.m_cols + 1));
            dVar12 = local_4b0;
          }
          if (lVar5 + 1 != 0) {
            std::__cxx11::string::substr((ulong)&local_4a8,(ulong)&local_4e0);
            pdVar1 = local_4a8.m_data;
            iVar9 = *piVar6;
            *piVar6 = 0;
            local_4b0 = strtod((char *)local_4a8.m_data,(char **)&local_478);
            if (local_478.m_data == pdVar1) goto LAB_00107310;
            if (*piVar6 != 0) {
              if (*piVar6 != 0x22) goto LAB_00106b4d;
              goto LAB_00107334;
            }
            *piVar6 = iVar9;
LAB_00106b4d:
            std::__cxx11::string::substr((ulong)&local_478,(ulong)&local_4e0);
            pdVar1 = local_478.m_data;
            iVar9 = *piVar6;
            *piVar6 = 0;
            dVar12 = strtod((char *)local_478.m_data,(char **)&local_410);
            if (local_410.m_data == pdVar1) goto LAB_00107328;
            if (*piVar6 == 0) {
              *piVar6 = iVar9;
LAB_00106ba5:
              if (((lVar5 < 0) || (local_420 <= (long)local_458)) || (local_418 <= lVar5)) {
LAB_001072e5:
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x16d,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              *(double *)((long)local_428 + (long)local_458 * 8 + local_420 * lVar5 * 8) =
                   local_4b0 + dVar12 / 10.0;
              if (local_478.m_data != (double *)&local_478.m_cols) {
                operator_delete(local_478.m_data,local_478.m_cols + 1);
              }
              if (local_4a8.m_data != (double *)&local_4a8.m_cols) {
                operator_delete(local_4a8.m_data,(ulong)((long)(double **)local_4a8.m_cols + 1));
              }
              goto LAB_00106c4c;
            }
            if (*piVar6 != 0x22) goto LAB_00106ba5;
            goto LAB_00107340;
          }
          iVar9 = (int)dVar12;
          if (((iVar9 < 0) || (local_438 <= (long)local_458)) || (local_430 <= iVar9))
          goto LAB_001072e5;
          *(undefined8 *)((long)local_440 + (long)local_458 * 8 + local_438 * iVar9 * 8) =
               0x3ff0000000000000;
LAB_00106c4c:
          std::__cxx11::string::erase((ulong)&local_4e0,0);
          lVar7 = std::__cxx11::string::find((char *)&local_4e0,(ulong)local_3f8[0],0);
          lVar5 = lVar5 + 1;
        } while (lVar7 != -1);
      }
      local_458 = (double)((long)local_458 + 1);
    }
    if (local_4e0.m_data != (double *)&local_4e0.m_cols) {
      operator_delete(local_4e0.m_data,local_4e0.m_cols + 1);
    }
  }
  local_4e0.m_data = (double *)0x14;
  local_4e0.m_rows = 4;
  local_4e0.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_478,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4e0);
  local_4e0.m_data = (double *)0x14;
  local_4e0.m_rows = 3;
  local_4e0.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_410,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4e0);
  local_3d8._M_x = 1;
  local_4e0.m_data = (double *)((long)local_428 + 0x3c0);
  local_3d0._M_a = 0;
  local_3d0._M_b = 0x77;
  local_4e0.m_cols = (Index)&local_428;
  local_4c8 = 0x78;
  local_4c0 = 0;
  local_4b8 = local_420;
  if ((local_420 < 0x96) || (local_418 < 4)) {
LAB_0010734c:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 30, BlockCols = 4, InnerPanel = false]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,4,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_320,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_> *)
               &local_4e0);
    local_4e0.m_data = (double *)((long)local_440 + 0x3c0);
    local_4e0.m_cols = (Index)&local_440;
    local_4c8 = 0x78;
    local_4c0 = 0;
    local_4b8 = local_438;
    if ((0x95 < local_438) && (2 < local_430)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,3,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_3,_false>_> *
                 )&local_4e0);
      local_458 = 0.1;
      uStack_450 = 0;
      dVar12 = 0.0;
      do {
        lVar7 = 0;
        lVar5 = 0;
        local_4b0 = dVar12;
        do {
          rVar3 = std::uniform_int_distribution<int>::operator()
                            ((uniform_int_distribution<int> *)&local_3d0,&local_3d8,&local_3d0);
          lVar11 = (long)rVar3;
          local_4e0.m_data = (double *)((long)local_428 + lVar11 * 8);
          local_4e0.m_cols = (Index)&local_428;
          local_4c0 = 0;
          local_4b8 = 1;
          local_4c8 = lVar11;
          if (((rVar3 < 0) || (local_420 <= lVar11)) || (local_418 < 4)) {
LAB_001072af:
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 4, InnerPanel = false]"
            ;
            goto LAB_001072db;
          }
          local_4a8.m_data = (double *)((long)local_478.m_data + lVar7);
          local_4a8.m_cols = (Index)&local_478;
          local_488 = 0;
          local_480 = 1;
          local_490 = lVar5;
          if ((local_478.m_rows <= lVar5) || (local_478.m_cols < 4)) goto LAB_001072af;
          Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>,_1>::
          operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1>
                     *)&local_4a8,
                    (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1>
                     *)&local_4e0);
          local_4e0.m_data = (double *)(lVar11 * 8 + (long)local_440);
          local_4e0.m_cols = (Index)&local_440;
          local_4c0 = 0;
          local_4b8 = 1;
          if ((local_438 <= lVar11) || (local_430 < 3)) {
LAB_001072c6:
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
            ;
            local_4c8 = lVar11;
            goto LAB_001072db;
          }
          local_4a8.m_data = (double *)((long)local_410.m_data + lVar7);
          local_4a8.m_cols = (Index)&local_410;
          local_488 = 0;
          local_480 = 1;
          local_490 = lVar5;
          if ((local_410.m_rows <= lVar5) || (local_410.m_cols < 3)) goto LAB_001072c6;
          local_4c8 = lVar11;
          Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>,_1>::
          operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>,_1>
                     *)&local_4a8,
                    (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>,_1>
                     *)&local_4e0);
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + 8;
        } while (lVar5 != 0x14);
        ANN::setLearningRate(&local_308,local_458);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_250,&local_478);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_268,&local_410);
        dVar12 = local_4b0;
        ANN::fit(&local_308,(MatrixXd *)&local_250,(MatrixXd *)&local_268);
        free(local_268.m_data);
        free(local_250.m_data);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_280,&local_320);
        ANN::predict((MatrixXd *)&local_4e0,&local_308,(MatrixXd *)&local_280);
        free(local_280.m_data);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_298,&local_478);
        ANN::predict((MatrixXd *)&local_4a8,&local_308,(MatrixXd *)&local_298);
        free(local_298.m_data);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,SUB84(dVar12,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_350,&local_4a8);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2b0,&local_410);
        dVar13 = comparePrediction((MatrixXd *)&local_350,(MatrixXd *)&local_2b0);
        poVar8 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_368,&local_4e0);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2c8,&local_338);
        dVar13 = comparePrediction((MatrixXd *)&local_368,(MatrixXd *)&local_2c8);
        poVar8 = std::ostream::_M_insert<double>(dVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        free(local_2c8.m_data);
        free(local_368.m_data);
        free(local_2b0.m_data);
        free(local_350.m_data);
        free(local_4a8.m_data);
        free(local_4e0.m_data);
        local_458 = (double)(~-(ulong)(0.01 < local_458) & (ulong)local_458 |
                            (ulong)(local_458 * 0.99) & -(ulong)(0.01 < local_458));
        uVar10 = SUB84(dVar12,0) + 1;
        dVar12 = (double)(ulong)uVar10;
        if (uVar10 == 1000) {
          free(local_338.m_data);
          free(local_320.m_data);
          free(local_410.m_data);
          free(local_478.m_data);
          free(local_440);
          free(local_428);
          if (local_3f8[0] != local_3e8) {
            operator_delete(local_3f8[0],local_3e8[0] + 1);
          }
          std::ifstream::~ifstream(local_238);
          ANN::~ANN(&local_308);
          return 0;
        }
      } while( true );
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 30, BlockCols = 3, InnerPanel = false]"
    ;
  }
LAB_001072db:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Block.h"
                ,0x85,__function);
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(4);
    n.addLayer(50, "tanh");
    n.addLayer(50, "tanh");
    n.addLayer(3, "sigmoid");

    ifstream file("/home/haukur/MasterProject/Plotting/iris.csv");
    string delimiter = ",";

    Eigen::MatrixXd X = Eigen::MatrixXd::Zero(150, 4);
    Eigen::MatrixXd y = Eigen::MatrixXd::Zero(150, 3);

    if(file.is_open()) {
        string line;
        int line_index = 0;
        while(getline(file, line)) {
            size_t pos = 0;
            int token;
            int index = -1;
            while ((pos = line.find(delimiter)) != std::string::npos) {
                token = stod(line.substr(0, pos));
                if(index == -1) {
                    y(line_index, token) = 1;
                }
                else {
                    X(line_index, index) = stod(line.substr(0, 1)) + stod(line.substr(2, 1))/10;
                }
                line.erase(0, pos + delimiter.length());
                index++;
            }
            line_index++;
        }
    }

    int batch_size = 20;

    Eigen::MatrixXd batch_X = Eigen::MatrixXd::Zero(batch_size, 4);
    Eigen::MatrixXd batch_y = Eigen::MatrixXd::Zero(batch_size, 3);

    std::default_random_engine generator;
    std::uniform_int_distribution<int> distribution(0,119);
    
    double learning_rate = 0.1;

    Eigen::MatrixXd validate_X = X.block<30,4>(120,0);
    Eigen::MatrixXd validate_y = y.block<30,3>(120,0);

    for(int i = 0; i < 1000; i++) {
        for(int i = 0; i < batch_size; i++) {
            int pick = distribution(generator);
            batch_X.block<1,4>(i, 0) = X.block<1,4>(pick, 0);
            batch_y.block<1,3>(i,0) = y.block<1,3>(pick, 0);
        }
        n.setLearningRate(learning_rate);
        n.fit(batch_X, batch_y);
        if(i % 1 == 0) {
            Eigen::MatrixXd prediction = n.predict(validate_X);
            Eigen::MatrixXd accuracy = n.predict(batch_X);
            cout << i << "," << comparePrediction(accuracy, batch_y) << "," << comparePrediction(prediction, validate_y) << endl;
            // Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            // cout << "Epoch: " << i << " MSE: " << se.mean() << " learning rate: " << learning_rate << endl;
        }
        if(learning_rate > 0.01)
            learning_rate *= 0.99;
    }
    
    return 0;
}